

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O0

void __thiscall Assimp::FIIntDecoder::~FIIntDecoder(FIIntDecoder *this)

{
  FIIntDecoder *this_local;
  
  ~FIIntDecoder(this);
  operator_delete(this);
  return;
}

Assistant:

virtual std::shared_ptr<const FIValue> decode(const uint8_t *data, size_t len) /*override*/ {
        if (len & 3) {
            throw DeadlyImportError(parseErrorMessage);
        }
        std::vector<int32_t> value;
        size_t numInts = len / 4;
        value.reserve(numInts);
        for (size_t i = 0; i < numInts; ++i) {
            int32_t v = (data[0] << 24) | (data[1] << 16) | (data[2] << 8) | data[3];
            value.push_back(v);
            data += 4;
        }
        return FIIntValue::create(std::move(value));
    }